

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O3

void __thiscall OSTEI_HRR_Writer::WriteHRR(OSTEI_HRR_Writer *this,ostream *os)

{
  QAM *tam;
  int iVar1;
  OSTEI_GeneratorInfo *pOVar2;
  pointer pcVar3;
  OSTEI_HRR_Algorithm_Base *this_00;
  bool bVar4;
  DoubletType DVar5;
  ostream *poVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *__end;
  undefined1 *puVar9;
  _Alloc_hider _Var10;
  undefined1 *puVar11;
  _Alloc_hider _Var12;
  char *__end_1;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  QAM am;
  QAM finalam;
  undefined1 local_2d8 [12];
  int iStack_2cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined1 local_2b8 [24];
  _Base_ptr local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  string local_288;
  string local_268;
  undefined1 local_248 [16];
  _Alloc_hider local_238;
  size_type local_230;
  char local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  size_type sStack_210;
  _Alloc_hider local_208;
  char local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type sStack_1e0;
  _Alloc_hider local_1d8;
  char local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  size_type sStack_1b0;
  _Alloc_hider local_1a8;
  char local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  size_type sStack_180;
  _Alloc_hider local_178;
  char local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type sStack_150;
  _Alloc_hider local_148;
  char local_138 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type sStack_120;
  _Alloc_hider local_118;
  char local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type sStack_f0;
  _Alloc_hider local_e8;
  char local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  pOVar2 = this->info_;
  local_248._0_8_ = *(undefined8 *)(pOVar2->super_GeneratorInfoBase).finalam_.qam._M_elems;
  local_248._8_8_ = *(undefined8 *)((pOVar2->super_GeneratorInfoBase).finalam_.qam._M_elems + 2);
  local_238._M_p = local_228;
  pcVar3 = (pOVar2->super_GeneratorInfoBase).finalam_.tag._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar3,
             pcVar3 + (pOVar2->super_GeneratorInfoBase).finalam_.tag._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent3_abi_cxx11_._M_dataplus._M_p,indent3_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"//////////////////////////////////////////////\n",0x2f);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent3_abi_cxx11_._M_dataplus._M_p,indent3_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"// Contracted integrals: Horizontal recurrance\n",0x2f);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent3_abi_cxx11_._M_dataplus._M_p,indent3_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"//////////////////////////////////////////////\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
  bVar4 = OSTEI_HRR_Algorithm_Base::HasBraHRR(this->hrr_algo_);
  if (bVar4) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,indent3_abi_cxx11_._M_dataplus._M_p,indent3_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"const double hAB[3] = { P.AB_x[ab], P.AB_y[ab], P.AB_z[ab] };\n",0x3e);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent3_abi_cxx11_._M_dataplus._M_p,indent3_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"for(abcd = 0; abcd < nshellbatch; ++abcd, ++real_abcd)\n",0x37);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent3_abi_cxx11_._M_dataplus._M_p,indent3_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{\n",2);
  bVar4 = OSTEI_HRR_Algorithm_Base::HasKetHRR(this->hrr_algo_);
  if (bVar4) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,indent4_abi_cxx11_._M_dataplus._M_p,indent4_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "const double hCD[3] = { Q.AB_x[cd+abcd], Q.AB_y[cd+abcd], Q.AB_z[cd+abcd] };\n",0x4d
              );
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent4_abi_cxx11_._M_dataplus._M_p,indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"// set up HRR pointers\n",0x17);
  OSTEI_HRR_Algorithm_Base::TopAM((QAMSet *)local_2d8,this->hrr_algo_);
  if ((_Rb_tree_node_base *)local_2c8._8_8_ != (_Rb_tree_node_base *)(local_2d8 + 8)) {
    uVar7 = local_2c8._8_8_;
    do {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent4_abi_cxx11_._M_dataplus._M_p,indent4_abi_cxx11_._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"double const * restrict ",0x18);
      tam = (QAM *)(uVar7 + 0x20);
      local_298._M_local_buf[2] = 'R';
      local_298._M_allocated_capacity._0_2_ = 0x5248;
      local_2a0 = (_Base_ptr)0x3;
      local_298._M_local_buf[3] = '\0';
      local_2b8._16_8_ = &local_298;
      ArrVarName(&local_288,tam,(string *)(local_2b8 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._16_8_ != &local_298) {
        operator_delete((void *)local_2b8._16_8_);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_288._M_dataplus._M_p,local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"","");
      ArrVarName((string *)(local_2b8 + 0x10),tam,&local_268);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_2b8._16_8_,(long)local_2a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," + abcd * ",10);
      local_c8 = *(undefined8 *)(tam->qam)._M_elems;
      uStack_c0 = ((_Rb_tree_node_base *)(uVar7 + 0x20))->_M_parent;
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,((_Rb_tree_node_base *)(uVar7 + 0x20))->_M_left,
                 (long)&((_Rb_tree_node_base *)(uVar7 + 0x20))->_M_left->_M_color +
                 (long)&((_Rb_tree_node_base *)(uVar7 + 0x20))->_M_right->_M_color);
      auVar13._0_4_ = (int)local_c8 + 2;
      auVar13._4_4_ = local_c8._4_4_ + 2;
      auVar13._8_4_ = (int)uStack_c0 + 2;
      auVar13._12_4_ = uStack_c0._4_4_ + 2;
      auVar16._4_4_ = local_c8._4_4_ + 1;
      auVar16._12_4_ = uStack_c0._4_4_ + 1;
      auVar16._0_4_ = auVar16._4_4_;
      auVar16._8_4_ = auVar16._12_4_;
      poVar6 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar6,
                          (~((int)uStack_c0 >> 0x1f) &
                          (uint)((auVar13._8_8_ & 0xffffffff) * (ulong)((int)uStack_c0 + 1)) >> 1) *
                          (~((int)local_c8 >> 0x1f) &
                          (uint)(auVar13._0_4_ * ((int)local_c8 + 1)) >> 1) *
                          (~(local_c8._4_4_ >> 0x1f) & (uint)(auVar16._4_4_ * auVar13._4_4_) >> 1) *
                          (~(uStack_c0._4_4_ >> 0x1f) &
                          (uint)((auVar16._8_8_ & 0xffffffff) * (ulong)auVar13._12_4_) >> 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._16_8_ != &local_298) {
        operator_delete((void *)local_2b8._16_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      uVar7 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar7);
    } while ((_Rb_tree_node_base *)uVar7 != (_Rb_tree_node_base *)(local_2d8 + 8));
  }
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            ((_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> *)
             local_2d8);
  iVar1 = (this->info_->super_GeneratorInfoBase).deriv_;
  if (iVar1 == 0) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,indent4_abi_cxx11_._M_dataplus._M_p,indent4_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"double * restrict ",0x12);
    local_2c8._M_allocated_capacity._0_4_ = 0x525248;
    stack0xfffffffffffffd30 = 3;
    local_2d8._0_8_ = &local_2c8;
    ArrVarName((string *)(local_2b8 + 0x10),(QAM *)local_248,(string *)local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._0_8_ != &local_2c8) {
      operator_delete((void *)local_2d8._0_8_);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_2b8._16_8_,(long)local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
    ArrVarName((string *)local_2d8,(QAM *)local_248,&local_288);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_2d8._0_8_,stack0xfffffffffffffd30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," + real_abcd * ",0xf);
    local_68 = local_248._0_4_;
    iStack_64 = local_248._4_4_;
    iStack_60 = local_248._8_4_;
    iStack_5c = local_248._12_4_;
    puVar11 = local_48;
    local_58[0] = puVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,local_238._M_p,local_238._M_p + local_230);
    auVar15._0_4_ = local_68 + 2;
    auVar15._4_4_ = iStack_64 + 2;
    auVar15._8_4_ = iStack_60 + 2;
    auVar15._12_4_ = iStack_5c + 2;
    auVar18._4_4_ = iStack_64 + 1;
    auVar18._12_4_ = iStack_5c + 1;
    auVar18._0_4_ = auVar18._4_4_;
    auVar18._8_4_ = auVar18._12_4_;
    poVar6 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar6,
                        (~(iStack_60 >> 0x1f) &
                        (uint)((auVar15._8_8_ & 0xffffffff) * (ulong)(iStack_60 + 1)) >> 1) *
                        (~(local_68 >> 0x1f) & (uint)(auVar15._0_4_ * (local_68 + 1)) >> 1) *
                        (~(iStack_64 >> 0x1f) & (uint)(auVar18._4_4_ * auVar15._4_4_) >> 1) *
                        (~(iStack_5c >> 0x1f) &
                        (uint)((auVar18._8_8_ & 0xffffffff) * (ulong)auVar15._12_4_) >> 1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
    puVar9 = local_58[0];
  }
  else {
    if (iVar1 != 1) goto LAB_00120150;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,indent4_abi_cxx11_._M_dataplus._M_p,indent4_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"double * restrict ",0x12);
    local_2c8._M_allocated_capacity._0_4_ = 0x525248;
    stack0xfffffffffffffd30 = 3;
    local_2d8._0_8_ = &local_2c8;
    ArrVarName((string *)(local_2b8 + 0x10),(QAM *)local_248,(string *)local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._0_8_ != &local_2c8) {
      operator_delete((void *)local_2d8._0_8_);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_2b8._16_8_,(long)local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
    ArrVarName((string *)local_2d8,(QAM *)local_248,&local_288);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_2d8._0_8_,stack0xfffffffffffffd30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," + real_abcd * ",0xf);
    local_98 = local_248._0_4_;
    iStack_94 = local_248._4_4_;
    iStack_90 = local_248._8_4_;
    iStack_8c = local_248._12_4_;
    puVar11 = local_78;
    local_88[0] = puVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_238._M_p,local_238._M_p + local_230);
    auVar14._0_4_ = local_98 + 2;
    auVar14._4_4_ = iStack_94 + 2;
    auVar14._8_4_ = iStack_90 + 2;
    auVar14._12_4_ = iStack_8c + 2;
    auVar17._4_4_ = iStack_94 + 1;
    auVar17._12_4_ = iStack_8c + 1;
    auVar17._0_4_ = auVar17._4_4_;
    auVar17._8_4_ = auVar17._12_4_;
    poVar6 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar6,
                        (~(iStack_90 >> 0x1f) &
                        (uint)((auVar14._8_8_ & 0xffffffff) * (ulong)(iStack_90 + 1)) >> 1) *
                        (~(local_98 >> 0x1f) & (uint)(auVar14._0_4_ * (local_98 + 1)) >> 1) *
                        (~(iStack_94 >> 0x1f) & (uint)(auVar17._4_4_ * auVar14._4_4_) >> 1) *
                        (~(iStack_8c >> 0x1f) &
                        (uint)((auVar17._8_8_ & 0xffffffff) * (ulong)auVar14._12_4_) >> 1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," * 12;\n",7);
    puVar9 = local_88[0];
  }
  if (puVar9 != puVar11) {
    operator_delete(puVar9);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ != &local_2c8) {
    operator_delete((void *)local_2d8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._16_8_ != &local_298) {
    operator_delete((void *)local_2b8._16_8_);
  }
LAB_00120150:
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  OSTEI_HRR_Algorithm_Base::GetAMOrder((QAMList *)&local_268,this->hrr_algo_);
  if (local_268._M_dataplus._M_p != (pointer)local_268._M_string_length) {
    _Var12._M_p = local_268._M_dataplus._M_p;
    do {
      local_2d8._0_8_ = *(undefined8 *)_Var12._M_p;
      unique0x10000ab5 = *(undefined8 *)((long)_Var12._M_p + 8);
      local_2c8._M_allocated_capacity = (size_type)local_2b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c8,*(long *)(_Var12._M_p + 0x10),
                 *(long *)(_Var12._M_p + 0x18) + *(long *)(_Var12._M_p + 0x10));
      this_00 = this->hrr_algo_;
      local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_2d8._0_8_;
      sStack_f0 = stack0xfffffffffffffd30;
      local_e8._M_p = local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_2c8._M_allocated_capacity,
                 (undefined1 *)(local_2c8._8_8_ + local_2c8._M_allocated_capacity));
      DVar5 = OSTEI_HRR_Algorithm_Base::GetDoubletStep(this_00,(QAM *)&local_f8);
      if (local_e8._M_p != local_d8) {
        operator_delete(local_e8._M_p);
      }
      if (DVar5 == BRA) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,indent4_abi_cxx11_._M_dataplus._M_p,
                            indent4_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"// form ",8);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"","");
        ArrVarName((string *)(local_2b8 + 0x10),(QAM *)local_2d8,&local_288);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_2b8._16_8_,(long)local_2a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._16_8_ != &local_298) {
          operator_delete((void *)local_2b8._16_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p);
        }
        if ((int)(local_2d8._4_4_ + local_2d8._0_4_) < this->start_external_) {
          local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8._0_8_;
          sStack_120 = stack0xfffffffffffffd30;
          local_118._M_p = local_108;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,local_2c8._M_allocated_capacity,
                     (undefined1 *)(local_2c8._8_8_ + local_2c8._M_allocated_capacity));
          WriteHRR_Bra_Inline_(this,os,(QAM *)&local_128);
          pcVar8 = local_108;
          _Var10._M_p = local_118._M_p;
        }
        else if ((int)(local_2d8._4_4_ + local_2d8._0_4_) < this->start_general_) {
          local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8._0_8_;
          sStack_150 = stack0xfffffffffffffd30;
          local_148._M_p = local_138;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_2c8._M_allocated_capacity,
                     (undefined1 *)(local_2c8._8_8_ + local_2c8._M_allocated_capacity));
          WriteHRR_Bra_External_(this,os,(QAM *)&local_158);
          pcVar8 = local_138;
          _Var10._M_p = local_148._M_p;
        }
        else {
          local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8._0_8_;
          sStack_180 = stack0xfffffffffffffd30;
          local_178._M_p = local_168;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,local_2c8._M_allocated_capacity,
                     (undefined1 *)(local_2c8._8_8_ + local_2c8._M_allocated_capacity));
          WriteHRR_Bra_General_(this,os,(QAM *)&local_188);
          pcVar8 = local_168;
          _Var10._M_p = local_178._M_p;
        }
        if (_Var10._M_p != pcVar8) {
          operator_delete(_Var10._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      }
      else {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,indent4_abi_cxx11_._M_dataplus._M_p,
                            indent4_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"// form ",8);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"","");
        ArrVarName((string *)(local_2b8 + 0x10),(QAM *)local_2d8,&local_288);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_2b8._16_8_,(long)local_2a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._16_8_ != &local_298) {
          operator_delete((void *)local_2b8._16_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p);
        }
        if (iStack_2cc + local_2d8._8_4_ < this->start_external_) {
          local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8._0_8_;
          sStack_1b0 = stack0xfffffffffffffd30;
          local_1a8._M_p = local_198;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,local_2c8._M_allocated_capacity,
                     (undefined1 *)(local_2c8._8_8_ + local_2c8._M_allocated_capacity));
          WriteHRR_Ket_Inline_(this,os,(QAM *)&local_1b8);
          pcVar8 = local_198;
          _Var10._M_p = local_1a8._M_p;
        }
        else if (iStack_2cc + local_2d8._8_4_ < this->start_general_) {
          local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8._0_8_;
          sStack_1e0 = stack0xfffffffffffffd30;
          local_1d8._M_p = local_1c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,local_2c8._M_allocated_capacity,
                     (undefined1 *)(local_2c8._8_8_ + local_2c8._M_allocated_capacity));
          WriteHRR_Ket_External_(this,os,(QAM *)&local_1e8);
          pcVar8 = local_1c8;
          _Var10._M_p = local_1d8._M_p;
        }
        else {
          local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8._0_8_;
          sStack_210 = stack0xfffffffffffffd30;
          local_208._M_p = local_1f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,local_2c8._M_allocated_capacity,
                     (undefined1 *)(local_2c8._8_8_ + local_2c8._M_allocated_capacity));
          WriteHRR_Ket_General_(this,os,(QAM *)&local_218);
          pcVar8 = local_1f8;
          _Var10._M_p = local_208._M_p;
        }
        if (_Var10._M_p != pcVar8) {
          operator_delete(_Var10._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      }
      if ((_Base_ptr)local_2c8._M_allocated_capacity != (_Base_ptr)local_2b8) {
        operator_delete((void *)local_2c8._M_allocated_capacity);
      }
      _Var12._M_p = _Var12._M_p + 0x30;
    } while (_Var12._M_p != (pointer)local_268._M_string_length);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector((vector<QAM,_std::allocator<QAM>_> *)&local_268);
  if (local_238._M_p != local_228) {
    operator_delete(local_238._M_p);
  }
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR(std::ostream & os) const
{
    QAM finalam = info_.FinalAM();

    os << indent3 << "//////////////////////////////////////////////\n";
    os << indent3 << "// Contracted integrals: Horizontal recurrance\n";
    os << indent3 << "//////////////////////////////////////////////\n";
    os << "\n\n";

    if(hrr_algo_.HasBraHRR())
        os << indent3 << "const double hAB[3] = { P.AB_x[ab], P.AB_y[ab], P.AB_z[ab] };\n"; 
    os << "\n\n";

    os << indent3 << "for(abcd = 0; abcd < nshellbatch; ++abcd, ++real_abcd)\n";
    os << indent3 << "{\n";

    if(hrr_algo_.HasKetHRR())
        os << indent4 << "const double hCD[3] = { Q.AB_x[cd+abcd], Q.AB_y[cd+abcd], Q.AB_z[cd+abcd] };\n";
    os << "\n";
    os << indent4 << "// set up HRR pointers\n";
    for(const auto & it : hrr_algo_.TopAM())
        os << indent4 << "double const * restrict " << HRRVarName(it) << " = " << ArrVarName(it) << " + abcd * " << NCART(it) << ";\n";

    // and also for the final integral
    if(info_.Deriv() == 0)
        os << indent4 << "double * restrict " << HRRVarName(finalam) << " = " << ArrVarName(finalam) << " + real_abcd * " << NCART(finalam) << ";\n";
    else if(info_.Deriv() == 1)
        os << indent4 << "double * restrict " << HRRVarName(finalam) << " = " << ArrVarName(finalam) << " + real_abcd * " << NCART(finalam) << " * 12;\n";
    os << "\n";

    for(auto am : hrr_algo_.GetAMOrder())
    {
        DoubletType steptype = hrr_algo_.GetDoubletStep(am);

        if(steptype == DoubletType::BRA)
        {
            os << indent4 << "// form " << ArrVarName(am) << "\n";
            int L = am[0] + am[1];

            if(L < start_external_)
                WriteHRR_Bra_Inline_(os, am);
            else if(L < start_general_)
                WriteHRR_Bra_External_(os, am);
            else
                WriteHRR_Bra_General_(os, am);
            os << "\n";
        }
        else
        {
            os << indent4 << "// form " << ArrVarName(am) << "\n";
            int L = am[2] + am[3];

            if(L < start_external_)
                WriteHRR_Ket_Inline_(os, am);
            else if(L < start_general_)
                WriteHRR_Ket_External_(os, am);
            else
                WriteHRR_Ket_General_(os, am);
            os << "\n";
        }
    }

}